

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O0

QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> * __thiscall
QAccessibleWidget::relations(QAccessibleWidget *this,Relation match)

{
  bool bVar1;
  Int IVar2;
  QWidget *pQVar3;
  QWidget *pQVar4;
  QObject *pQVar5;
  qsizetype qVar6;
  QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> *this_00;
  const_reference ppQVar7;
  long lVar8;
  long *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int i;
  int sig;
  QObject *connectionObject;
  QGroupBox *groupbox;
  QLabel *labelSibling;
  QWidget *kid;
  QList<QWidget_*> *__range3;
  QWidget *parent;
  QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> *rels;
  QAccessibleInterface *iface_2;
  Relation rel_1;
  QObjectList receivers;
  QObjectList allReceivers;
  QAccessibleInterface *iface_1;
  QAccessibleInterface *iface;
  const_iterator __end3;
  const_iterator __begin3;
  QList<QWidget_*> kids;
  Relation rel;
  undefined4 in_stack_fffffffffffffe88;
  RelationFlag in_stack_fffffffffffffe8c;
  QLabel *in_stack_fffffffffffffe90;
  QGroupBox *in_stack_fffffffffffffe98;
  byte local_151;
  int local_130;
  int local_12c;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  QList<QObject_*> local_90;
  QFlagsStorageHelper<QAccessible::RelationFlag,_4> local_74;
  undefined8 local_70;
  undefined8 local_50;
  QWidget **local_48;
  const_iterator local_40;
  const_iterator local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined4 local_14;
  QFlagsStorageHelper<QAccessible::RelationFlag,_4> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> **)&in_RDI->field_0x8 =
       (pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->super_QPaintDevice = &DAT_aaaaaaaaaaaaaaaa;
  QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>::QList
            ((QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> *)
             0x7dd65a);
  local_10.super_QFlagsStorage<QAccessible::RelationFlag>.i =
       (QFlagsStorage<QAccessible::RelationFlag>)
       QFlags<QAccessible::RelationFlag>::operator&
                 ((QFlags<QAccessible::RelationFlag> *)in_stack_fffffffffffffe90,
                  in_stack_fffffffffffffe8c);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
  if (IVar2 != 0) {
    local_14 = 0xaaaaaaaa;
    QFlags<QAccessible::RelationFlag>::QFlags
              ((QFlags<QAccessible::RelationFlag> *)in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe8c);
    widget((QAccessibleWidget *)0x7dd6b2);
    pQVar3 = QWidget::parentWidget((QWidget *)0x7dd6ba);
    if (pQVar3 != (QWidget *)0x0) {
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      _q_ac_childWidgets(in_RDI);
      local_38.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      local_38 = QList<QWidget_*>::begin((QList<QWidget_*> *)in_stack_fffffffffffffe90);
      local_40.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      local_40 = QList<QWidget_*>::end((QList<QWidget_*> *)in_stack_fffffffffffffe90);
      while( true ) {
        local_48 = local_40.i;
        bVar1 = QList<QWidget_*>::const_iterator::operator!=(&local_38,local_40);
        if (!bVar1) break;
        QList<QWidget_*>::const_iterator::operator*(&local_38);
        pQVar5 = (QObject *)qobject_cast<QLabel*>((QObject *)0x7dd7be);
        if (pQVar5 != (QObject *)0x0) {
          pQVar3 = QLabel::buddy(in_stack_fffffffffffffe90);
          pQVar4 = widget((QAccessibleWidget *)0x7dd7e4);
          if (pQVar3 == pQVar4) {
            local_50 = QAccessible::queryAccessibleInterface(pQVar5);
            QList<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>::
            emplace_back<QAccessibleInterface*&,QFlags<QAccessible::RelationFlag>const&>
                      ((QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>
                        *)in_stack_fffffffffffffe90,
                       (QAccessibleInterface **)
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                       (QFlags<QAccessible::RelationFlag> *)0x7dd81d);
          }
        }
        QList<QWidget_*>::const_iterator::operator++(&local_38);
      }
      pQVar5 = (QObject *)qobject_cast<QGroupBox*>((QObject *)0x7dd840);
      local_151 = 0;
      if (pQVar5 != (QObject *)0x0) {
        QGroupBox::title(in_stack_fffffffffffffe98);
        bVar1 = QString::isEmpty((QString *)0x7dd87f);
        local_151 = bVar1 ^ 0xff;
        QString::~QString((QString *)0x7dd8a3);
      }
      if ((local_151 & 1) != 0) {
        local_70 = QAccessible::queryAccessibleInterface(pQVar5);
        QList<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>::
        emplace_back<QAccessibleInterface*&,QFlags<QAccessible::RelationFlag>const&>
                  ((QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> *)
                   in_stack_fffffffffffffe90,
                   (QAccessibleInterface **)
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   (QFlags<QAccessible::RelationFlag> *)0x7dd8d9);
      }
      QList<QWidget_*>::~QList((QList<QWidget_*> *)0x7dd8e6);
    }
  }
  local_74.super_QFlagsStorage<QAccessible::RelationFlag>.i =
       (QFlagsStorage<QAccessible::RelationFlag>)
       QFlags<QAccessible::RelationFlag>::operator&
                 ((QFlags<QAccessible::RelationFlag> *)in_stack_fffffffffffffe90,
                  in_stack_fffffffffffffe8c);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_74);
  if (IVar2 != 0) {
    local_90.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_90.d.ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_90.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QObject_*>::QList((QList<QObject_*> *)0x7dd951);
    (**(code **)(*in_RSI + 0x18))();
    for (local_12c = 0; qVar6 = QList<QString>::size((QList<QString> *)(in_RSI[3] + 0x20)),
        local_12c < qVar6; local_12c = local_12c + 1) {
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      local_a0 = &DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      QObject::d_func((QObject *)0x7dd9cd);
      QList<QString>::at((QList<QString> *)in_stack_fffffffffffffe90,
                         CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      QString::toLatin1((QString *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      QByteArray::operator_cast_to_char_((QByteArray *)0x7dda09);
      QObjectPrivate::receiverList((char *)&local_a8);
      QByteArray::~QByteArray((QByteArray *)0x7dda2b);
      QList<QObject_*>::operator+=
                ((QList<QObject_*> *)in_stack_fffffffffffffe90,
                 (QList<QObject_*> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      QList<QObject_*>::~QList((QList<QObject_*> *)0x7dda4d);
    }
    (**(code **)(*in_RSI + 0x18))();
    QList<QObject*>::removeAll<QObject*>
              ((QList<QObject_*> *)in_stack_fffffffffffffe90,
               (QObject **)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    local_130 = 0;
    while( true ) {
      this_00 = (QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> *)
                (long)local_130;
      qVar6 = QList<QObject_*>::size(&local_90);
      if (qVar6 <= (long)this_00) break;
      QFlags<QAccessible::RelationFlag>::QFlags
                ((QFlags<QAccessible::RelationFlag> *)this_00,in_stack_fffffffffffffe8c);
      ppQVar7 = QList<QObject_*>::at
                          ((QList<QObject_*> *)this_00,
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      lVar8 = QAccessible::queryAccessibleInterface(*ppQVar7);
      if (lVar8 != 0) {
        QList<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>::
        emplace_back<QAccessibleInterface*&,QFlags<QAccessible::RelationFlag>const&>
                  (this_00,(QAccessibleInterface **)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   (QFlags<QAccessible::RelationFlag> *)0x7ddb17);
      }
      local_130 = local_130 + 1;
    }
    QList<QObject_*>::~QList((QList<QObject_*> *)0x7ddb36);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<std::pair<QAccessibleInterface *, QAccessible::Relation>>
QAccessibleWidget::relations(QAccessible::Relation match /*= QAccessible::AllRelations*/) const
{
    QList<std::pair<QAccessibleInterface *, QAccessible::Relation>> rels;
    if (match & QAccessible::Label) {
        const QAccessible::Relation rel = QAccessible::Label;
        if (QWidget *parent = widget()->parentWidget()) {
#if QT_CONFIG(shortcut) && QT_CONFIG(label)
            // first check for all siblings that are labels to us
            // ideally we would go through all objects and check, but that
            // will be too expensive
            const QList<QWidget*> kids = _q_ac_childWidgets(parent);
            for (QWidget *kid : kids) {
                if (QLabel *labelSibling = qobject_cast<QLabel*>(kid)) {
                    if (labelSibling->buddy() == widget()) {
                        QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(labelSibling);
                        rels.emplace_back(iface, rel);
                    }
                }
            }
#endif
#if QT_CONFIG(groupbox)
            QGroupBox *groupbox = qobject_cast<QGroupBox*>(parent);
            if (groupbox && !groupbox->title().isEmpty()) {
                QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(groupbox);
                rels.emplace_back(iface, rel);
            }
#endif
        }
    }

    if (match & QAccessible::Controlled) {
        QObjectList allReceivers;
        QObject *connectionObject = object();
        for (int sig = 0; sig < d->primarySignals.size(); ++sig) {
            const QObjectList receivers = connectionObject->d_func()->receiverList(d->primarySignals.at(sig).toLatin1());
            allReceivers += receivers;
        }

        allReceivers.removeAll(object());  //### The object might connect to itself internally

        for (int i = 0; i < allReceivers.size(); ++i) {
            const QAccessible::Relation rel = QAccessible::Controlled;
            QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(allReceivers.at(i));
            if (iface)
                rels.emplace_back(iface, rel);
        }
    }

    return rels;
}